

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::LabelTests_PrintHieroLexicalMulti_Test::TestBody
          (LabelTests_PrintHieroLexicalMulti_Test *this)

{
  char *in_RCX;
  char *message;
  string_view line;
  AssertHelper AStack_288;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  AlignedSentencePair asp;
  PhrasalRule rule;
  ostringstream s;
  
  line._M_str = in_RCX;
  line._M_len = (size_t)"a\tb c d\t0-0";
  readAlignedSentencePair<false,false>(&asp,(thrax *)0xb,line);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  PhrasalRule::PhrasalRule(&rule,&asp);
  thrax::operator<<((ostream *)&s,&rule);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[16],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"[X]\\ta\\tb c d\\t0-0\"","s.str()",
             (char (*) [16])"[X]\ta\tb c d\t0-0",&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_270);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x1c,message);
    testing::internal::AssertHelper::operator=(&AStack_288,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper(&AStack_288);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_270);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  AlignedSentencePair::~AlignedSentencePair(&asp);
  return;
}

Assistant:

TEST(LabelTests, PrintHieroLexicalMulti) {
  auto asp = readAlignedSentencePair<false, false>("a\tb c d\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  s << rule;
  EXPECT_EQ("[X]\ta\tb c d\t0-0", s.str());
}